

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::BufferLoadStoreTestInstance::commandBindDescriptorsForLayer
          (BufferLoadStoreTestInstance *this,VkCommandBuffer cmdBuffer,
          VkPipelineLayout pipelineLayout,int layerNdx)

{
  DeviceInterface *pDVar1;
  VkCommandBuffer pVVar2;
  BufferLoadStoreTestInstance *pBVar3;
  Handle<(vk::HandleType)22> *pHVar4;
  Handle<(vk::HandleType)12> *pHVar5;
  DescriptorSetUpdateBuilder *pDVar6;
  Location local_b0;
  VkDescriptorSet local_a8;
  Location local_90;
  VkDescriptorSet local_88;
  DescriptorSetUpdateBuilder local_80;
  DeviceInterface *local_38;
  DeviceInterface *vk;
  VkDevice device;
  VkCommandBuffer pVStack_20;
  int layerNdx_local;
  VkCommandBuffer cmdBuffer_local;
  BufferLoadStoreTestInstance *this_local;
  VkPipelineLayout pipelineLayout_local;
  
  device._4_4_ = layerNdx;
  pVStack_20 = cmdBuffer;
  cmdBuffer_local = (VkCommandBuffer)this;
  this_local = (BufferLoadStoreTestInstance *)pipelineLayout.m_internal;
  vk = (DeviceInterface *)
       Context::getDevice((this->super_LoadStoreTestInstance).super_BaseTestInstance.
                          super_TestInstance.m_context);
  local_38 = Context::getDeviceInterface
                       ((this->super_LoadStoreTestInstance).super_BaseTestInstance.
                        super_TestInstance.m_context);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_80);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                     (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  local_88.m_internal = pHVar4->m_internal;
  local_90 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::get
                     (&(this->m_bufferViewSrc).super_RefBase<vk::Handle<(vk::HandleType)12>_>);
  pDVar6 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (&local_80,local_88,&local_90,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,pHVar5);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                     (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  local_a8.m_internal = pHVar4->m_internal;
  local_b0 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::get
                     (&(this->m_bufferViewDst).super_RefBase<vk::Handle<(vk::HandleType)12>_>);
  pDVar6 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (pDVar6,local_a8,&local_b0,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,pHVar5);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar6,local_38,(VkDevice)vk);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_80);
  pBVar3 = this_local;
  pVVar2 = pVStack_20;
  pDVar1 = local_38;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                     (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  (*pDVar1->_vptr_DeviceInterface[0x56])(pDVar1,pVVar2,1,pBVar3,0,1,pHVar4,0,0);
  return;
}

Assistant:

void BufferLoadStoreTestInstance::commandBindDescriptorsForLayer (const VkCommandBuffer cmdBuffer, const VkPipelineLayout pipelineLayout, const int layerNdx)
{
	DE_ASSERT(layerNdx == 0);
	DE_UNREF(layerNdx);

	const VkDevice			device	= m_context.getDevice();
	const DeviceInterface&	vk		= m_context.getDeviceInterface();

	DescriptorSetUpdateBuilder()
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER, &m_bufferViewSrc.get())
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER, &m_bufferViewDst.get())
		.update(vk, device);
	vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, pipelineLayout, 0u, 1u, &m_descriptorSet.get(), 0u, DE_NULL);
}